

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_16x8_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  byte bVar2;
  code *pcVar3;
  undefined8 uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int8_t *piVar9;
  bool bVar10;
  int16_t *piVar11;
  uint uVar12;
  undefined7 in_register_00000009;
  long lVar13;
  undefined8 *puVar14;
  bool bVar15;
  ulong uVar16;
  undefined8 *puVar17;
  long lVar18;
  undefined4 uVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 uVar24;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined4 uVar38;
  undefined1 auVar41 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined4 uVar53;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i buf0 [16];
  __m128i buf1 [16];
  code *local_248;
  int16_t *local_240;
  undefined8 local_238 [2];
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined1 local_218 [16];
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined1 local_1f8 [16];
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined1 local_1d8 [16];
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined8 local_138 [5];
  undefined8 uStack_110;
  undefined8 auStack_108 [2];
  undefined8 uStack_f8;
  undefined8 auStack_f0 [4];
  undefined8 uStack_d0;
  undefined8 auStack_c8 [2];
  undefined4 auStack_b8 [34];
  undefined1 auVar20 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [12];
  undefined1 auVar43 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  
  piVar9 = av1_fwd_txfm_shift_ls[8];
  uVar16 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_248 = *(code **)((long)col_txfm8x8_arr + uVar16);
  pcVar3 = *(code **)((long)row_txfm8x16_arr + uVar16);
  lVar18 = 0;
  puVar17 = local_238;
  bVar10 = true;
  local_240 = input;
  do {
    bVar15 = bVar10;
    piVar11 = local_240 + lVar18 * 8;
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar13 = 0x80;
      do {
        uVar4 = *(undefined8 *)(piVar11 + 4);
        *(undefined8 *)((long)&local_248 + lVar13) = *(undefined8 *)piVar11;
        *(undefined8 *)((long)&local_240 + lVar13) = uVar4;
        piVar11 = piVar11 + stride;
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
    }
    else {
      lVar13 = 0;
      do {
        uVar4 = *(undefined8 *)(piVar11 + 4);
        *(undefined8 *)((long)local_238 + lVar13) = *(undefined8 *)piVar11;
        *(undefined8 *)((long)local_238 + lVar13 + 8) = uVar4;
        lVar13 = lVar13 + 0x10;
        piVar11 = piVar11 + stride;
      } while (lVar13 != 0x80);
    }
    bVar2 = *piVar9;
    uVar12 = (uint)(char)bVar2;
    if ((int)uVar12 < 0) {
      auVar21 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar21 = pshuflw(auVar21,auVar21,0);
      auVar21._4_4_ = auVar21._0_4_;
      auVar21._8_4_ = auVar21._0_4_;
      auVar21._12_4_ = auVar21._0_4_;
      lVar13 = 0;
      do {
        auVar27 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar13),auVar21);
        auVar27 = psraw(auVar27,ZEXT416(-uVar12));
        *(undefined1 (*) [16])((long)local_238 + lVar13) = auVar27;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x80);
    }
    else if (bVar2 != 0) {
      lVar13 = 0;
      do {
        auVar21 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar13),ZEXT416(uVar12));
        *(undefined1 (*) [16])((long)local_238 + lVar13) = auVar21;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x80);
    }
    (*local_248)(puVar17,puVar17,0xd);
    bVar2 = piVar9[1];
    uVar12 = (uint)(char)bVar2;
    if ((int)uVar12 < 0) {
      auVar21 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar21 = pshuflw(auVar21,auVar21,0);
      auVar27._0_4_ = auVar21._0_4_;
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      lVar13 = 0;
      do {
        auVar21 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar13),auVar27);
        auVar21 = psraw(auVar21,ZEXT416(-uVar12));
        *(undefined1 (*) [16])((long)local_238 + lVar13) = auVar21;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x80);
    }
    else if (bVar2 != 0) {
      lVar13 = 0;
      do {
        auVar21 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar13),ZEXT416(uVar12));
        *(undefined1 (*) [16])((long)local_238 + lVar13) = auVar21;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x80);
    }
    lVar13 = lVar18 * 0x80;
    auVar31._0_12_ = local_238._0_12_;
    auVar31._12_2_ = local_238[0]._6_2_;
    auVar31._14_2_ = uStack_222;
    auVar30._12_4_ = auVar31._12_4_;
    auVar30._0_10_ = local_238._0_10_;
    auVar30._10_2_ = uStack_224;
    auVar29._10_6_ = auVar30._10_6_;
    auVar29._0_8_ = local_238[0];
    auVar29._8_2_ = local_238[0]._4_2_;
    auVar5._4_8_ = auVar29._8_8_;
    auVar5._2_2_ = uStack_226;
    auVar5._0_2_ = local_238[0]._2_2_;
    auVar28._0_4_ = CONCAT22(local_228,(short)local_238[0]);
    auVar28._4_12_ = auVar5;
    auVar51._0_12_ = local_218._0_12_;
    auVar51._12_2_ = local_218._6_2_;
    auVar51._14_2_ = uStack_202;
    auVar50._12_4_ = auVar51._12_4_;
    auVar50._0_10_ = local_218._0_10_;
    auVar50._10_2_ = uStack_204;
    auVar49._10_6_ = auVar50._10_6_;
    auVar49._0_8_ = local_218._0_8_;
    auVar49._8_2_ = local_218._4_2_;
    auVar6._4_8_ = auVar49._8_8_;
    auVar6._2_2_ = uStack_206;
    auVar6._0_2_ = local_218._2_2_;
    auVar36._0_12_ = local_1f8._0_12_;
    auVar36._12_2_ = local_1f8._6_2_;
    auVar36._14_2_ = uStack_1e2;
    auVar35._12_4_ = auVar36._12_4_;
    auVar35._0_10_ = local_1f8._0_10_;
    auVar35._10_2_ = uStack_1e4;
    auVar34._10_6_ = auVar35._10_6_;
    auVar34._0_8_ = local_1f8._0_8_;
    auVar34._8_2_ = local_1f8._4_2_;
    auVar7._4_8_ = auVar34._8_8_;
    auVar7._2_2_ = uStack_1e6;
    auVar7._0_2_ = local_1f8._2_2_;
    auVar33._0_4_ = CONCAT22(local_1e8,local_1f8._0_2_);
    auVar33._4_12_ = auVar7;
    auVar59._0_12_ = local_1d8._0_12_;
    auVar59._12_2_ = local_1d8._6_2_;
    auVar59._14_2_ = uStack_1c2;
    auVar58._12_4_ = auVar59._12_4_;
    auVar58._0_10_ = local_1d8._0_10_;
    auVar58._10_2_ = uStack_1c4;
    auVar57._10_6_ = auVar58._10_6_;
    auVar57._0_8_ = local_1d8._0_8_;
    auVar57._8_2_ = local_1d8._4_2_;
    auVar8._4_8_ = auVar57._8_8_;
    auVar8._2_2_ = uStack_1c6;
    auVar8._0_2_ = local_1d8._2_2_;
    uVar19 = CONCAT22(uStack_220,(short)local_238[1]);
    auVar20._0_8_ = CONCAT26(uStack_21e,CONCAT24(local_238[1]._2_2_,uVar19));
    auVar20._8_2_ = local_238[1]._4_2_;
    auVar20._10_2_ = uStack_21c;
    auVar46._12_2_ = local_238[1]._6_2_;
    auVar46._0_12_ = auVar20;
    auVar46._14_2_ = uStack_21a;
    uVar38 = CONCAT22(uStack_200,local_218._8_2_);
    auVar39._0_8_ = CONCAT26(uStack_1fe,CONCAT24(local_218._10_2_,uVar38));
    auVar39._8_2_ = local_218._12_2_;
    auVar39._10_2_ = uStack_1fc;
    auVar40._12_2_ = local_218._14_2_;
    auVar40._0_12_ = auVar39;
    auVar40._14_2_ = uStack_1fa;
    uVar24 = CONCAT22(uStack_1e0,local_1f8._8_2_);
    auVar25._0_8_ = CONCAT26(uStack_1de,CONCAT24(local_1f8._10_2_,uVar24));
    auVar25._8_2_ = local_1f8._12_2_;
    auVar25._10_2_ = uStack_1dc;
    auVar26._12_2_ = local_1f8._14_2_;
    auVar26._0_12_ = auVar25;
    auVar26._14_2_ = uStack_1da;
    uVar53 = CONCAT22(uStack_1c0,local_1d8._8_2_);
    auVar54._0_8_ = CONCAT26(uStack_1be,CONCAT24(local_1d8._10_2_,uVar53));
    auVar54._8_2_ = local_1d8._12_2_;
    auVar54._10_2_ = uStack_1bc;
    auVar55._12_2_ = local_1d8._14_2_;
    auVar55._0_12_ = auVar54;
    auVar55._14_2_ = uStack_1ba;
    auVar47._0_8_ = auVar28._0_8_;
    auVar47._8_4_ = auVar5._0_4_;
    auVar47._12_4_ = auVar6._0_4_;
    auVar48._0_8_ = auVar33._0_8_;
    auVar48._8_4_ = auVar7._0_4_;
    auVar48._12_4_ = auVar8._0_4_;
    auVar52._8_4_ = (int)((ulong)auVar20._0_8_ >> 0x20);
    auVar52._0_8_ = auVar20._0_8_;
    auVar52._12_4_ = (int)((ulong)auVar39._0_8_ >> 0x20);
    auVar56._8_4_ = (int)((ulong)auVar25._0_8_ >> 0x20);
    auVar56._0_8_ = auVar25._0_8_;
    auVar56._12_4_ = (int)((ulong)auVar54._0_8_ >> 0x20);
    auVar32._0_8_ = CONCAT44(auVar49._8_4_,auVar29._8_4_);
    auVar32._8_4_ = auVar30._12_4_;
    auVar32._12_4_ = auVar50._12_4_;
    auVar22._0_8_ = CONCAT44(auVar39._8_4_,auVar20._8_4_);
    auVar22._8_4_ = auVar46._12_4_;
    auVar22._12_4_ = auVar40._12_4_;
    local_138[lVar18 * 0x10] = CONCAT44(CONCAT22(local_208,local_218._0_2_),auVar28._0_4_);
    local_138[lVar18 * 0x10 + 1] = CONCAT44(CONCAT22(local_1c8,local_1d8._0_2_),auVar33._0_4_);
    local_138[lVar18 * 0x10 + 2] = auVar47._8_8_;
    (&uStack_110)[lVar18 * 0x10 + -2] = auVar48._8_8_;
    (&uStack_110)[lVar18 * 0x10 + -1] = auVar32._0_8_;
    *(int *)(&uStack_110 + lVar18 * 0x10) = auVar34._8_4_;
    *(int *)((long)auStack_108 + lVar13 + -4) = auVar57._8_4_;
    auStack_108[lVar18 * 0x10] = auVar32._8_8_;
    *(undefined4 *)(&uStack_f8 + lVar18 * 0x10) = auVar35._12_4_;
    *(undefined4 *)((long)&uStack_f8 + lVar13 + 4) = auVar58._12_4_;
    (&uStack_f8)[lVar18 * 0x10] = CONCAT44(uVar38,uVar19);
    auStack_f0[lVar18 * 0x10] = CONCAT44(uVar53,uVar24);
    auStack_f0[lVar18 * 0x10 + 1] = auVar52._8_8_;
    auStack_f0[lVar18 * 0x10 + 2] = auVar56._8_8_;
    (&uStack_d0)[lVar18 * 0x10 + -1] = auVar22._0_8_;
    *(int *)(&uStack_d0 + lVar18 * 0x10) = auVar25._8_4_;
    *(int *)((long)auStack_c8 + lVar13 + -4) = auVar54._8_4_;
    auStack_c8[lVar18 * 0x10] = auVar22._8_8_;
    auStack_b8[lVar18 * 0x20] = auVar26._12_4_;
    auStack_b8[lVar18 * 0x20 + 1] = auVar55._12_4_;
    lVar18 = 1;
    bVar10 = false;
  } while (bVar15);
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar18 = 0x100;
    puVar14 = local_138;
    do {
      uVar4 = puVar14[1];
      *(undefined8 *)((long)&local_248 + lVar18) = *puVar14;
      *(undefined8 *)((long)&local_240 + lVar18) = uVar4;
      puVar14 = puVar14 + 2;
      lVar18 = lVar18 + -0x10;
    } while (lVar18 != 0);
  }
  else {
    puVar17 = local_138;
  }
  (*pcVar3)(puVar17,puVar17,0xd);
  auVar21 = _DAT_00562cc0;
  bVar2 = piVar9[2];
  if ((char)bVar2 < '\0') {
    auVar27 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar27 = pshuflw(auVar27,auVar27,0);
    auVar23._0_4_ = auVar27._0_4_;
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = auVar23._0_4_;
    auVar23._12_4_ = auVar23._0_4_;
    lVar18 = 0;
    do {
      auVar27 = paddsw(*(undefined1 (*) [16])((long)puVar17 + lVar18),auVar23);
      auVar27 = psraw(auVar27,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar17 + lVar18) = auVar27;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x100);
  }
  else if (bVar2 != 0) {
    lVar18 = 0;
    do {
      auVar27 = psllw(*(undefined1 (*) [16])((long)puVar17 + lVar18),ZEXT416((uint)(int)(char)bVar2)
                     );
      *(undefined1 (*) [16])((long)puVar17 + lVar18) = auVar27;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x100);
  }
  lVar18 = 0;
  do {
    auVar27 = *(undefined1 (*) [16])((long)puVar17 + lVar18);
    auVar45._0_12_ = auVar27._0_12_;
    auVar45._12_2_ = auVar27._6_2_;
    auVar45._14_2_ = 1;
    auVar44._12_4_ = auVar45._12_4_;
    auVar44._0_10_ = auVar27._0_10_;
    auVar44._10_2_ = 1;
    auVar43._10_6_ = auVar44._10_6_;
    auVar43._0_8_ = auVar27._0_8_;
    auVar43._8_2_ = auVar27._4_2_;
    auVar42._8_8_ = auVar43._8_8_;
    auVar42._0_8_ = 0x1000000000000;
    auVar41._6_10_ = auVar42._6_10_;
    auVar41._4_2_ = auVar27._2_2_;
    auVar41._0_2_ = auVar27._0_2_;
    auVar41._2_2_ = 1;
    auVar37._2_2_ = 0;
    auVar37._0_2_ = auVar27._8_2_;
    auVar37._4_2_ = auVar27._10_2_;
    auVar37._6_2_ = 0;
    auVar37._8_2_ = auVar27._12_2_;
    auVar37._10_2_ = 0;
    auVar37._12_2_ = auVar27._14_2_;
    auVar37._14_2_ = 1;
    auVar46 = pmaddwd(auVar41,auVar21);
    auVar27 = pmaddwd(auVar37,auVar21);
    piVar1 = (int *)((long)output + lVar18 * 2);
    *piVar1 = auVar46._0_4_ >> 0xc;
    piVar1[1] = auVar46._4_4_ >> 0xc;
    piVar1[2] = auVar46._8_4_ >> 0xc;
    piVar1[3] = auVar46._12_4_ >> 0xc;
    piVar1 = (int *)((long)output + lVar18 * 2 + 0x10);
    *piVar1 = auVar27._0_4_ >> 0xc;
    piVar1[1] = auVar27._4_4_ >> 0xc;
    piVar1[2] = auVar27._8_4_ >> 0xc;
    piVar1[3] = auVar27._12_4_ >> 0xc;
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x100);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x8_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
    } else {
      load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    }
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    transpose_16bit_8x8(buf0, buf1 + 8 * i);
  }

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}